

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

void check_here(boolean picked_some)

{
  obj *poVar1;
  int obj_cnt;
  vptrs *pvVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((flags.run == 8) && (flags.travel != '\0')) {
    bVar3 = iflags.autoexplore == '\0';
  }
  obj_cnt = 0;
  pvVar2 = (vptrs *)(level->objects[u.ux] + u.uy);
  while (poVar1 = pvVar2->v_nexthere, poVar1 != (obj *)0x0) {
    obj_cnt = obj_cnt + (uint)(poVar1 != uchain);
    pvVar2 = &poVar1->v;
  }
  if ((obj_cnt != 0) && ((bVar3 || ((level->locations[u.ux][u.uy].field_0x6 & 4) == 0)))) {
    if (flags.run != 0) {
      nomul(0,(char *)0x0);
    }
    flush_screen();
    look_here(obj_cnt,picked_some);
    return;
  }
  read_engr_at((int)u.ux,(int)u.uy);
  return;
}

Assistant:

static void check_here(boolean picked_some)
{
	struct obj *obj;
	int ct = 0;
	boolean autoexploring = (flags.run == 8 &&
				 flags.travel && iflags.autoexplore);

	/* count the objects here */
	for (obj = level->objects[u.ux][u.uy]; obj; obj = obj->nexthere) {
	    if (obj != uchain)
		ct++;
	}

	/* If there are objects here, take a look unless
	 * autoexploring a previously explored space. */
	if (ct && !(autoexploring && level->locations[u.ux][u.uy].mem_stepped)) {
	    if (flags.run) nomul(0, NULL);
	    flush_screen();
	    look_here(ct, picked_some);
	} else {
	    read_engr_at(u.ux,u.uy);
	}
}